

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::LosslessTestLarge::PreEncodeFrameHook(LosslessTestLarge *this)

{
  Encoder *in_stack_00000010;
  VideoSource *in_stack_00000018;
  LosslessTestLarge *in_stack_00000020;
  
  anon_unknown.dwarf_4b12d7::LosslessTestLarge::PreEncodeFrameHook
            (in_stack_00000020,in_stack_00000018,in_stack_00000010);
  return;
}

Assistant:

void PreEncodeFrameHook(::libaom_test::VideoSource *video,
                          ::libaom_test::Encoder *encoder) override {
    if (video->frame() == 0) {
      // Only call Control if quantizer > 0 to verify that using quantizer
      // alone will activate lossless
      if (cfg_.rc_max_quantizer > 0 || cfg_.rc_min_quantizer > 0) {
        encoder->Control(AV1E_SET_LOSSLESS, 1);
      }
      encoder->Control(AOME_SET_CPUUSED, cpu_used_);
    }
  }